

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Latch.hpp
# Opt level: O3

void __thiscall gmlc::concurrency::Latch::arrive(Latch *this)

{
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_20;
  
  local_20._M_owns = false;
  local_20._M_device = &this->mtx;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  LOCK();
  (this->counter_).super___atomic_base<int>._M_i =
       (this->counter_).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((this->counter_).super___atomic_base<int>._M_i == 0) {
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void arrive()
        {
            std::unique_lock<std::mutex> lck(mtx);
            --counter_;
            if (counter_ == 0) {
                cv.notify_all();
            }
        }